

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionValTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,string *field_name,Type *union_type,bool is_array)

{
  ImportDefinition *__return_storage_ptr___00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  allocator<char> local_3f9;
  string local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  string conversion_function_1;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string conversion_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_binded_method;
  bool union_has_string;
  undefined1 local_158 [8];
  string union_accessor;
  undefined1 local_68 [8];
  string enum_type;
  EnumDef *enum_def;
  bool is_array_local;
  Type *union_type_local;
  string *field_name_local;
  StructDef *dependent_local;
  import_set *imports_local;
  TsGenerator *this_local;
  string *ret;
  
  if (union_type->enum_def == (EnumDef *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                  ,0x454,
                  "std::string flatbuffers::ts::TsGenerator::GenUnionValTS(import_set &, const StructDef &, const std::string &, const Type &, const bool)"
                 );
  }
  enum_type.field_2._8_8_ = union_type->enum_def;
  __return_storage_ptr___00 = (ImportDefinition *)(union_accessor.field_2._M_local_buf + 8);
  AddImport<flatbuffers::EnumDef>
            (__return_storage_ptr___00,this,imports,&dependent->super_Definition,
             (EnumDef *)enum_type.field_2._8_8_);
  std::__cxx11::string::string((string *)local_68,(string *)__return_storage_ptr___00);
  anon_unknown_10::ImportDefinition::~ImportDefinition(__return_storage_ptr___00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 "this.",field_name);
  field_binded_method.field_2._M_local_buf[0xb] =
       UnionHasStringType(this,(EnumDef *)enum_type.field_2._8_8_);
  std::operator+(&local_1a8,"this.",field_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 &local_1a8,".bind(this)");
  std::__cxx11::string::~string((string *)&local_1a8);
  conversion_function.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (is_array) {
    GenUnionListConvFuncName_abi_cxx11_((string *)local_2f8,this,(EnumDef *)enum_type.field_2._8_8_)
    ;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(() => {\n");
    GenObjApiUnionTypeTS
              (&local_358,this,imports,union_type->struct_def,
               &((this->super_BaseGenerator).parser_)->opts,union_type->enum_def);
    std::operator+(&local_338,"    const ret: (",&local_358);
    std::operator+(&local_318,&local_338,")[] = [];\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"TypeLength",&local_3f9)
    ;
    Namer::Method(&local_3d8,&(this->namer_).super_Namer,field_name,&local_3f8);
    std::operator+(&local_3b8,"    for(let targetEnumIndex = 0; targetEnumIndex < this.",&local_3d8)
    ;
    std::operator+(&local_398,&local_3b8,"()");
    std::operator+(&local_378,&local_398,"; ++targetEnumIndex) {\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"Type",&local_481);
    Namer::Method(&local_460,&(this->namer_).super_Namer,field_name,&local_480);
    std::operator+(&local_440,"      const targetEnum = this.",&local_460);
    std::operator+(&local_420,&local_440,"(targetEnumIndex);\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::operator+(&local_4c8,"      if(targetEnum === null || ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+(&local_4a8,&local_4c8,"[targetEnum!] === \'NONE\') { continue; }\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::operator+(&local_548,"      const temp = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    std::operator+(&local_528,&local_548,"(targetEnum, ");
    std::operator+(&local_508,&local_528,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::operator+(&local_4e8,&local_508,", targetEnumIndex);\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"      if(temp === null) { continue; }\n");
    pcVar1 = "";
    if ((field_binded_method.field_2._M_local_buf[0xb] & 1U) != 0) {
      pcVar1 = "      if(typeof temp === \'string\') { ret.push(temp); continue; }\n";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"      ret.push(temp.unpack());\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    }\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    return ret;\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  })()");
    std::__cxx11::string::~string((string *)local_2f8);
  }
  else {
    GenUnionConvFuncName_abi_cxx11_((string *)local_1d0,this,(EnumDef *)enum_type.field_2._8_8_);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(() => {\n");
    std::operator+(&local_290,"      const temp = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    std::operator+(&local_270,&local_290,"(this.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"Type",
               (allocator<char> *)(conversion_function_1.field_2._M_local_buf + 0xf));
    Namer::Method(&local_2b0,&(this->namer_).super_Namer,field_name,&local_2d0);
    std::operator+(&local_250,&local_270,&local_2b0);
    std::operator+(&local_230,&local_250,"(), ");
    std::operator+(&local_210,&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::operator+(&local_1f0,&local_210,");\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(conversion_function_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"      if(temp === null) { return null; }\n");
    pcVar1 = "";
    if ((field_binded_method.field_2._M_local_buf[0xb] & 1U) != 0) {
      pcVar1 = "      if(typeof temp === \'string\') { return temp; }\n";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"      return temp.unpack()\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  })()");
    std::__cxx11::string::~string((string *)local_1d0);
  }
  conversion_function.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnionValTS(import_set &imports, const StructDef &dependent,
                            const std::string &field_name,
                            const Type &union_type,
                            const bool is_array = false) {
    if (union_type.enum_def) {
      const auto &enum_def = *union_type.enum_def;
      const auto enum_type = AddImport(imports, dependent, enum_def).name;
      const std::string union_accessor = "this." + field_name;

      const auto union_has_string = UnionHasStringType(enum_def);
      const auto field_binded_method = "this." + field_name + ".bind(this)";

      std::string ret;

      if (!is_array) {
        const auto conversion_function = GenUnionConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "      const temp = " + conversion_function + "(this." +
               namer_.Method(field_name, "Type") + "(), " +
               field_binded_method + ");\n";
        ret += "      if(temp === null) { return null; }\n";
        ret += union_has_string
                   ? "      if(typeof temp === 'string') { return temp; }\n"
                   : "";
        ret += "      return temp.unpack()\n";
        ret += "  })()";
      } else {
        const auto conversion_function = GenUnionListConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "    const ret: (" +
               GenObjApiUnionTypeTS(imports, *union_type.struct_def,
                                    parser_.opts, *union_type.enum_def) +
               ")[] = [];\n";
        ret += "    for(let targetEnumIndex = 0; targetEnumIndex < this." +
               namer_.Method(field_name, "TypeLength") + "()" +
               "; "
               "++targetEnumIndex) {\n";
        ret += "      const targetEnum = this." +
               namer_.Method(field_name, "Type") + "(targetEnumIndex);\n";
        ret += "      if(targetEnum === null || " + enum_type +
               "[targetEnum!] === 'NONE') { "
               "continue; }\n\n";
        ret += "      const temp = " + conversion_function + "(targetEnum, " +
               field_binded_method + ", targetEnumIndex);\n";
        ret += "      if(temp === null) { continue; }\n";
        ret += union_has_string ? "      if(typeof temp === 'string') { "
                                  "ret.push(temp); continue; }\n"
                                : "";
        ret += "      ret.push(temp.unpack());\n";
        ret += "    }\n";
        ret += "    return ret;\n";
        ret += "  })()";
      }

      return ret;
    }

    FLATBUFFERS_ASSERT(0);
    return "";
  }